

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2sAnalyzer.cpp
# Opt level: O0

U32 __thiscall
I2sAnalyzer::GenerateSimulationData
          (I2sAnalyzer *this,U64 newest_sample_requested,U32 sample_rate,
          SimulationChannelDescriptor **simulation_channels)

{
  U32 UVar1;
  element_type *settings;
  SimulationChannelDescriptor **simulation_channels_local;
  U32 sample_rate_local;
  U64 newest_sample_requested_local;
  I2sAnalyzer *this_local;
  
  if ((this->mSimulationInitilized & 1U) == 0) {
    UVar1 = Analyzer::GetSimulationSampleRate();
    settings = std::auto_ptr<I2sAnalyzerSettings>::get(&this->mSettings);
    I2sSimulationDataGenerator::Initialize(&this->mSimulationDataGenerator,UVar1,settings);
    this->mSimulationInitilized = true;
  }
  UVar1 = I2sSimulationDataGenerator::GenerateSimulationData
                    (&this->mSimulationDataGenerator,newest_sample_requested,sample_rate,
                     simulation_channels);
  return UVar1;
}

Assistant:

U32 I2sAnalyzer::GenerateSimulationData( U64 newest_sample_requested, U32 sample_rate, SimulationChannelDescriptor** simulation_channels )
{
    if( mSimulationInitilized == false )
    {
        mSimulationDataGenerator.Initialize( GetSimulationSampleRate(), mSettings.get() );
        mSimulationInitilized = true;
    }

    return mSimulationDataGenerator.GenerateSimulationData( newest_sample_requested, sample_rate, simulation_channels );
}